

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeMessage
          (ParserImpl *this,Message *message,string *delimiter)

{
  size_t sVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  undefined1 *local_78;
  size_t local_70;
  undefined1 local_68 [16];
  undefined1 *local_58;
  size_t local_50;
  undefined1 local_48 [16];
  string *local_38;
  
  local_38 = delimiter;
  do {
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,">","");
    sVar1 = (this->tokenizer_).current_.text._M_string_length;
    if (sVar1 == local_70) {
      if (sVar1 == 0) {
        bVar3 = true;
      }
      else {
        iVar2 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_78,sVar1);
        bVar3 = iVar2 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if (bVar3) {
LAB_002fec65:
      bVar4 = false;
    }
    else {
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"}","");
      sVar1 = (this->tokenizer_).current_.text._M_string_length;
      bVar4 = true;
      if (sVar1 == local_50) {
        if (sVar1 == 0) goto LAB_002fec65;
        iVar2 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_58,sVar1);
        bVar4 = iVar2 != 0;
      }
    }
    if ((!bVar3) && (local_58 != local_48)) {
      operator_delete(local_58);
    }
    if (local_78 != local_68) {
      operator_delete(local_78);
    }
    if (!bVar4) {
      bVar3 = Consume(this,local_38);
      return bVar3;
    }
    bVar3 = ConsumeField(this,message);
    if (!bVar3) {
      return false;
    }
  } while( true );
}

Assistant:

bool ConsumeMessage(Message* message, const std::string delimiter) {
    while (!LookingAt(">") && !LookingAt("}")) {
      DO(ConsumeField(message));
    }

    // Confirm that we have a valid ending delimiter.
    DO(Consume(delimiter));
    return true;
  }